

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniformDefinitions
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          string *out_source_code)

{
  undefined *puVar1;
  size_t sVar2;
  ostream *poVar3;
  stringstream stream;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  getAmountUniforms(this,shader_stage,uniform_type);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout(std140) uniform ",0x17);
  puVar1 = m_uniform_block_name;
  if (m_uniform_block_name == (undefined *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(m_uniform_block_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,puVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"    ",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(uniform_type->m_type_name)._M_dataplus._M_p,
                      (uniform_type->m_type_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," uniform_array[",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"};\n\n",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_source_code,(string *)local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformDefinitions(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
												   std::string& out_source_code) const
{
	const glw::GLuint n_uniforms = getAmountUniforms(shader_stage, uniform_type);
	std::stringstream stream;

	/*
	 * layout(std140) uniform M_UNIFORM_BLOCK_NAME
	 * {
	 *     TYPE_NAME uniform_array[N_UNIFORMS];
	 * };
	 */
	stream << "layout(std140) uniform " << m_uniform_block_name << "\n"
																   "{\n";

	stream << "    " << uniform_type.m_type_name << " uniform_array[" << n_uniforms << "];\n";

	stream << "};\n\n";

	out_source_code = stream.str();
}